

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O3

Tcl_HashEntry * Tcl_NextHashEntry(Tcl_HashSearch *searchPtr)

{
  int iVar1;
  Tcl_HashEntry *pTVar2;
  long lVar3;
  int iVar4;
  
  pTVar2 = searchPtr->nextEntryPtr;
  if (pTVar2 == (Tcl_HashEntry *)0x0) {
    iVar1 = searchPtr->tablePtr->numBuckets;
    iVar4 = searchPtr->nextIndex;
    lVar3 = (long)iVar4;
    if (iVar1 < iVar4) {
      iVar1 = iVar4;
    }
    do {
      iVar4 = iVar4 + 1;
      if (iVar1 == lVar3) {
        return (Tcl_HashEntry *)0x0;
      }
      pTVar2 = searchPtr->tablePtr->buckets[lVar3];
      searchPtr->nextEntryPtr = pTVar2;
      lVar3 = lVar3 + 1;
      searchPtr->nextIndex = iVar4;
    } while (pTVar2 == (Tcl_HashEntry *)0x0);
  }
  searchPtr->nextEntryPtr = pTVar2->nextPtr;
  return pTVar2;
}

Assistant:

Tcl_HashEntry *
Tcl_NextHashEntry(register Tcl_HashSearch *searchPtr)
{
    Tcl_HashEntry *hPtr;

    while (searchPtr->nextEntryPtr == NULL) {
	if (searchPtr->nextIndex >= searchPtr->tablePtr->numBuckets) {
	    return NULL;
	}
	searchPtr->nextEntryPtr =
	    searchPtr->tablePtr->buckets[searchPtr->nextIndex];
	searchPtr->nextIndex++;
    }
    hPtr = searchPtr->nextEntryPtr;
    searchPtr->nextEntryPtr = hPtr->nextPtr;
    return hPtr;
}